

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

int __thiscall CTcGenTarg::add_meta(CTcGenTarg *this,char *nm,size_t len,CTcSymMetaclass *sym)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 in_RCX;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  bool bVar3;
  size_t rem;
  char *p;
  char *extra_ptr;
  size_t extra_len;
  tc_meta_entry *ent;
  ulong local_48;
  char *local_40;
  char *local_38;
  size_t local_30;
  
  local_48 = in_RDX;
  local_40 = in_RSI;
  while( true ) {
    bVar3 = false;
    if (local_48 != 0) {
      bVar3 = *local_40 != '/';
    }
    if (!bVar3) break;
    local_40 = local_40 + 1;
    local_48 = local_48 - 1;
  }
  if (local_48 == 0) {
    local_30 = 7;
    local_38 = "/000000";
  }
  else if (local_48 < 7) {
    local_30 = 7 - local_48;
    local_38 = "000000";
  }
  else {
    local_30 = 0;
    local_38 = (char *)0x0;
  }
  puVar2 = (undefined8 *)malloc(in_RDX + 0x18 + local_30);
  if (puVar2 != (undefined8 *)0x0) {
    memcpy(puVar2 + 2,in_RSI,in_RDX);
    if (local_30 != 0) {
      memcpy((void *)((long)puVar2 + in_RDX + 0x10),local_38,local_30);
    }
    *(undefined1 *)((long)puVar2 + in_RDX + local_30 + 0x10) = 0;
    puVar2[1] = in_RCX;
    *puVar2 = 0;
    if (*(long *)(in_RDI + 0x28) == 0) {
      *(undefined8 **)(in_RDI + 0x20) = puVar2;
    }
    else {
      **(undefined8 **)(in_RDI + 0x28) = puVar2;
    }
    *(undefined8 **)(in_RDI + 0x28) = puVar2;
    iVar1 = *(int *)(in_RDI + 0x30);
    *(int *)(in_RDI + 0x30) = iVar1 + 1;
    return iVar1;
  }
  err_throw(0);
}

Assistant:

int CTcGenTarg::add_meta(const char *nm, size_t len,
                         CTcSymMetaclass *sym)
{
    tc_meta_entry *ent;
    size_t extra_len;
    const char *extra_ptr;
    const char *p;
    size_t rem;

    /* 
     *   if the name string doesn't contain a slash, allocate enough space
     *   to add an implied version suffix of "/000000" 
     */
    for (p = nm, rem = len ; rem != 0 && *p != '/' ; ++p, --rem) ;
    if (rem == 0)
    {
        /* we didn't find a version suffix - add space for one */
        extra_len = 7;
        extra_ptr = "/000000";
    }
    else
    {
        /* 
         *   there's already a version suffix - but make sure we have
         *   space for a six-character string 
         */
        if (rem < 7)
        {
            /* add zeros to pad out to a six-place version string */
            extra_len = 7 - rem;
            extra_ptr = "000000";
        }
        else
        {
            /* we need nothing extra */
            extra_len = 0;
            extra_ptr = 0;
        }
    }
    
    /* allocate a new entry for the item */
    ent = (tc_meta_entry *)t3malloc(sizeof(tc_meta_entry) + len + extra_len);
    if (ent == 0)
        err_throw(TCERR_CODEGEN_NO_MEM);

    /* copy the name into the entry */
    memcpy(ent->nm, nm, len);

    /* add any extra version suffix information */
    if (extra_len != 0)
        memcpy(ent->nm + len, extra_ptr, extra_len);

    /* null-terminate the name string in the entry */
    ent->nm[len + extra_len] = '\0';

    /* remember the symbol */
    ent->sym = sym;

    /* link the entry in at the end of the list */
    ent->nxt = 0;
    if (meta_tail_ != 0)
        meta_tail_->nxt = ent;
    else
        meta_head_ = ent;
    meta_tail_ = ent;

    /* count the entry, returning the index of the entry in the list */
    return meta_cnt_++;
}